

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O0

char * Wlc_PrsFindSymbol(char *pStr,char Symb)

{
  bool bVar1;
  int fNotName;
  char Symb_local;
  char *pStr_local;
  
  bVar1 = true;
  _fNotName = pStr;
  while( true ) {
    if (*_fNotName == '\0') {
      return (char *)0x0;
    }
    if ((bVar1) && (*_fNotName == Symb)) break;
    if (*_fNotName == '\\') {
      bVar1 = false;
    }
    else if ((!bVar1) && (*_fNotName == ' ')) {
      bVar1 = true;
    }
    _fNotName = _fNotName + 1;
  }
  return _fNotName;
}

Assistant:

static inline char * Wlc_PrsFindSymbol( char * pStr, char Symb )
{
    int fNotName = 1;
    for ( ; *pStr; pStr++ )
    {
        if ( fNotName && *pStr == Symb )
            return pStr;
        if ( pStr[0] == '\\' )
            fNotName = 0;
        else if ( !fNotName && *pStr == ' ' )
            fNotName = 1;
    }
    return NULL;
}